

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

string * __thiscall units::repr_abi_cxx11_(string *__return_storage_ptr__,units *this,char *str)

{
  string local_40;
  allocator local_19;
  
  std::__cxx11::string::string((string *)&local_40,(char *)this,&local_19);
  repr(__return_storage_ptr__,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string repr(char* str) {
    return repr(string(str));
}